

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void ggml_compute_forward_dup(ggml_compute_params *params,ggml_tensor *src0,ggml_tensor *dst)

{
  ggml_type gVar1;
  ggml_type gVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint *puVar16;
  ulong uVar17;
  int iVar18;
  size_t sVar19;
  ulong uVar20;
  size_t sVar21;
  long lVar22;
  ushort *puVar23;
  long lVar24;
  long lVar25;
  undefined4 *puVar26;
  ulong uVar27;
  long lVar28;
  undefined2 *puVar29;
  undefined1 auVar30 [16];
  long local_70;
  ulong local_58;
  
  gVar1 = src0->type;
  uVar15 = (ulong)gVar1;
  switch(uVar15) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 7:
    ggml_compute_forward_dup_cold_1();
    goto LAB_0012ddee;
  case 5:
    if (params->ith == 0) {
      gVar2 = dst->type;
      uVar17 = (ulong)gVar2;
      if (dst->nb[0] != GGML_TYPE_SIZE[uVar17]) {
LAB_0012ddee:
        ggml_compute_forward_dup_cold_8();
        goto LAB_0012ddf3;
      }
      if (dst->nb[1] != (dst->nb[0] * (long)dst->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[uVar17])
      goto LAB_0012ddee;
      if ((dst->nb[2] != dst->nb[1] * (long)dst->ne[1]) ||
         (dst->nb[3] != dst->nb[2] * (long)dst->ne[2])) goto LAB_0012ddee;
      iVar18 = dst->ne[1] * dst->ne[0] * dst->ne[2] * dst->ne[3];
      uVar3 = src0->ne[0];
      uVar4 = src0->ne[1];
      iVar5 = src0->ne[2];
      lVar22 = (long)iVar5;
      uVar6 = src0->ne[3];
      uVar13 = (ulong)uVar6;
      if (iVar18 != uVar6 * iVar5 * uVar4 * uVar3) goto LAB_0012de02;
      if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
        return;
      }
      sVar7 = src0->nb[0];
      uVar8 = src0->nb[1];
      sVar9 = src0->nb[2];
      sVar10 = src0->nb[3];
      sVar19 = GGML_TYPE_SIZE[uVar15];
      if ((((sVar7 == sVar19) &&
           (uVar8 == (sVar7 * (long)(int)uVar3) / (ulong)(long)GGML_BLCK_SIZE[uVar15])) &&
          (sVar9 == uVar8 * (long)(int)uVar4)) && ((gVar1 == gVar2 && (sVar10 == sVar9 * lVar22))))
      {
LAB_0012d89c:
        memcpy(dst->data,src0->data,(long)iVar18 * sVar19);
        return;
      }
      uVar15 = (ulong)uVar3;
      uVar14 = (ulong)uVar4;
      if (sVar7 != 2) {
        if (uVar17 == 5) {
          if (0 < (int)uVar6) {
            pvVar11 = dst->data;
            lVar25 = 0;
            uVar17 = 0;
            iVar18 = 0;
            do {
              if (0 < iVar5) {
                lVar24 = 0;
                lVar12 = lVar25;
                do {
                  if (0 < (int)uVar4) {
                    uVar20 = 0;
                    lVar28 = lVar12;
                    do {
                      if (0 < (int)uVar3) {
                        puVar29 = (undefined2 *)((long)src0->data + lVar28);
                        uVar27 = 0;
                        do {
                          *(undefined2 *)((long)pvVar11 + uVar27 * 2 + (long)iVar18 * 2) = *puVar29;
                          uVar27 = uVar27 + 1;
                          puVar29 = (undefined2 *)((long)puVar29 + sVar7);
                        } while (uVar15 != uVar27);
                        iVar18 = iVar18 + (int)uVar27;
                      }
                      uVar20 = uVar20 + 1;
                      lVar28 = lVar28 + uVar8;
                    } while (uVar20 != uVar14);
                  }
                  lVar24 = lVar24 + 1;
                  lVar12 = lVar12 + sVar9;
                } while (lVar24 != lVar22);
              }
              uVar17 = uVar17 + 1;
              lVar25 = lVar25 + sVar10;
            } while (uVar17 != uVar13);
            return;
          }
          return;
        }
        if (gVar2 == GGML_TYPE_F32) {
          if (0 < (int)uVar6) {
            pvVar11 = dst->data;
            lVar25 = 0;
            uVar17 = 0;
            iVar18 = 0;
            do {
              if (0 < iVar5) {
                lVar24 = 0;
                lVar12 = lVar25;
                do {
                  if (0 < (int)uVar4) {
                    uVar20 = 0;
                    lVar28 = lVar12;
                    do {
                      if (0 < (int)uVar3) {
                        puVar23 = (ushort *)((long)src0->data + lVar28);
                        uVar27 = 0;
                        do {
                          *(float *)((long)pvVar11 + uVar27 * 4 + (long)iVar18 * 4) =
                               table_f32_f16[*puVar23];
                          uVar27 = uVar27 + 1;
                          puVar23 = (ushort *)((long)puVar23 + sVar7);
                        } while (uVar15 != uVar27);
                        iVar18 = iVar18 + (int)uVar27;
                      }
                      uVar20 = uVar20 + 1;
                      lVar28 = lVar28 + uVar8;
                    } while (uVar20 != uVar14);
                  }
                  lVar24 = lVar24 + 1;
                  lVar12 = lVar12 + sVar9;
                } while (lVar24 != lVar22);
              }
              uVar17 = uVar17 + 1;
              lVar25 = lVar25 + sVar10;
            } while (uVar17 != uVar13);
            return;
          }
          return;
        }
        goto LAB_0012de1b;
      }
      if (uVar17 == 6) {
        if ((int)uVar6 < 1) {
          return;
        }
        pvVar11 = dst->data;
        lVar25 = 0;
        uVar17 = 0;
        iVar18 = 0;
        do {
          if (0 < iVar5) {
            lVar24 = 0;
            lVar12 = lVar25;
            do {
              if (0 < (int)uVar4) {
                uVar20 = 0;
                lVar28 = lVar12;
                do {
                  if (0 < (int)uVar3) {
                    puVar23 = (ushort *)((long)src0->data + lVar28);
                    uVar27 = 0;
                    do {
                      *(float *)((long)pvVar11 + uVar27 * 4 + (long)iVar18 * 4) =
                           table_f32_f16[*puVar23];
                      uVar27 = uVar27 + 1;
                      puVar23 = puVar23 + 1;
                    } while (uVar15 != uVar27);
                    iVar18 = iVar18 + (int)uVar27;
                  }
                  uVar20 = uVar20 + 1;
                  lVar28 = lVar28 + uVar8;
                } while (uVar20 != uVar14);
              }
              lVar24 = lVar24 + 1;
              lVar12 = lVar12 + sVar9;
            } while (lVar24 != lVar22);
          }
          uVar17 = uVar17 + 1;
          lVar25 = lVar25 + sVar10;
        } while (uVar17 != uVar13);
        return;
      }
      if (gVar2 == GGML_TYPE_F16) {
        if (0 < (int)uVar6) {
          sVar21 = (long)(int)uVar3 * 2;
          local_70 = 0;
          local_58 = 0;
          iVar18 = 0;
          do {
            if (0 < iVar5) {
              lVar12 = 0;
              lVar25 = local_70;
              do {
                if (0 < (int)uVar4) {
                  lVar28 = sVar21 * (long)iVar18;
                  iVar18 = iVar18 + uVar4;
                  uVar15 = uVar14;
                  lVar24 = lVar25;
                  do {
                    memcpy((void *)((long)dst->data + lVar28),(void *)((long)src0->data + lVar24),
                           sVar21);
                    lVar24 = lVar24 + uVar8;
                    lVar28 = lVar28 + sVar21;
                    uVar15 = uVar15 - 1;
                  } while (uVar15 != 0);
                }
                lVar12 = lVar12 + 1;
                lVar25 = lVar25 + sVar9;
              } while (lVar12 != lVar22);
            }
            local_58 = local_58 + 1;
            local_70 = local_70 + sVar10;
          } while (local_58 != uVar13);
          return;
        }
        return;
      }
    }
    else {
LAB_0012ddf8:
      ggml_compute_forward_dup_cold_7();
LAB_0012ddfd:
      ggml_compute_forward_dup_cold_2();
LAB_0012de02:
      ggml_compute_forward_dup_cold_9();
LAB_0012de07:
      ggml_compute_forward_dup_cold_4();
    }
    ggml_compute_forward_dup_cold_11();
LAB_0012de11:
    ggml_compute_forward_dup_cold_6();
    break;
  case 6:
    if (params->ith != 0) goto LAB_0012ddfd;
    gVar2 = dst->type;
    uVar17 = (ulong)gVar2;
    if (dst->nb[0] != GGML_TYPE_SIZE[uVar17]) {
LAB_0012ddf3:
      ggml_compute_forward_dup_cold_3();
      goto LAB_0012ddf8;
    }
    if (dst->nb[1] != (dst->nb[0] * (long)dst->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[uVar17])
    goto LAB_0012ddf3;
    if ((dst->nb[2] != dst->nb[1] * (long)dst->ne[1]) ||
       (dst->nb[3] != dst->nb[2] * (long)dst->ne[2])) goto LAB_0012ddf3;
    iVar18 = dst->ne[1] * dst->ne[0] * dst->ne[2] * dst->ne[3];
    uVar3 = src0->ne[0];
    uVar4 = src0->ne[1];
    iVar5 = src0->ne[2];
    lVar22 = (long)iVar5;
    uVar6 = src0->ne[3];
    uVar13 = (ulong)uVar6;
    if (iVar18 != uVar6 * iVar5 * uVar4 * uVar3) goto LAB_0012de07;
    if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
      return;
    }
    sVar7 = src0->nb[0];
    uVar8 = src0->nb[1];
    sVar9 = src0->nb[2];
    sVar10 = src0->nb[3];
    sVar19 = GGML_TYPE_SIZE[uVar15];
    if ((((sVar7 == sVar19) &&
         (uVar8 == (sVar7 * (long)(int)uVar3) / (ulong)(long)GGML_BLCK_SIZE[uVar15])) &&
        (sVar9 == uVar8 * (long)(int)uVar4)) && ((gVar1 == gVar2 && (sVar10 == sVar9 * lVar22))))
    goto LAB_0012d89c;
    uVar15 = (ulong)uVar3;
    uVar14 = (ulong)uVar4;
    if (sVar7 == 4) {
      if (uVar17 == 5) {
        if (0 < (int)uVar6) {
          lVar25 = 0;
          uVar17 = 0;
          do {
            if (0 < iVar5) {
              lVar24 = 0;
              lVar12 = lVar25;
              do {
                if (0 < (int)uVar4) {
                  uVar20 = 0;
                  lVar28 = lVar12;
                  do {
                    if (0 < (int)uVar3) {
                      puVar16 = (uint *)((long)src0->data + lVar28);
                      uVar27 = 0;
                      do {
                        auVar30 = vcvtps2ph_f16c(ZEXT416(*puVar16),0);
                        vpextrw_avx(auVar30,0);
                        uVar27 = uVar27 + 1;
                        puVar16 = puVar16 + 1;
                      } while (uVar15 != uVar27);
                    }
                    uVar20 = uVar20 + 1;
                    lVar28 = lVar28 + uVar8;
                  } while (uVar20 != uVar14);
                }
                lVar24 = lVar24 + 1;
                lVar12 = lVar12 + sVar9;
              } while (lVar24 != lVar22);
            }
            uVar17 = uVar17 + 1;
            lVar25 = lVar25 + sVar10;
          } while (uVar17 != uVar13);
          return;
        }
        return;
      }
      if (gVar2 == GGML_TYPE_F32) {
        if (0 < (int)uVar6) {
          sVar21 = (long)(int)uVar3 * 4;
          local_70 = 0;
          local_58 = 0;
          iVar18 = 0;
          do {
            if (0 < iVar5) {
              lVar12 = 0;
              lVar25 = local_70;
              do {
                if (0 < (int)uVar4) {
                  lVar28 = sVar21 * (long)iVar18;
                  iVar18 = iVar18 + uVar4;
                  uVar15 = uVar14;
                  lVar24 = lVar25;
                  do {
                    memcpy((void *)((long)dst->data + lVar28),(void *)((long)src0->data + lVar24),
                           sVar21);
                    lVar24 = lVar24 + uVar8;
                    lVar28 = lVar28 + sVar21;
                    uVar15 = uVar15 - 1;
                  } while (uVar15 != 0);
                }
                lVar12 = lVar12 + 1;
                lVar25 = lVar25 + sVar9;
              } while (lVar12 != lVar22);
            }
            local_58 = local_58 + 1;
            local_70 = local_70 + sVar10;
          } while (local_58 != uVar13);
          return;
        }
        return;
      }
      goto LAB_0012de11;
    }
    if (uVar17 == 5) {
      if (0 < (int)uVar6) {
        lVar25 = 0;
        uVar17 = 0;
        do {
          if (0 < iVar5) {
            lVar24 = 0;
            lVar12 = lVar25;
            do {
              if (0 < (int)uVar4) {
                uVar20 = 0;
                lVar28 = lVar12;
                do {
                  if (0 < (int)uVar3) {
                    puVar16 = (uint *)((long)src0->data + lVar28);
                    uVar27 = 0;
                    do {
                      auVar30 = vcvtps2ph_f16c(ZEXT416(*puVar16),0);
                      vpextrw_avx(auVar30,0);
                      uVar27 = uVar27 + 1;
                      puVar16 = (uint *)((long)puVar16 + sVar7);
                    } while (uVar15 != uVar27);
                  }
                  uVar20 = uVar20 + 1;
                  lVar28 = lVar28 + uVar8;
                } while (uVar20 != uVar14);
              }
              lVar24 = lVar24 + 1;
              lVar12 = lVar12 + sVar9;
            } while (lVar24 != lVar22);
          }
          uVar17 = uVar17 + 1;
          lVar25 = lVar25 + sVar10;
        } while (uVar17 != uVar13);
        return;
      }
      return;
    }
    if (gVar2 == GGML_TYPE_F32) {
      if (0 < (int)uVar6) {
        pvVar11 = dst->data;
        lVar25 = 0;
        uVar17 = 0;
        iVar18 = 0;
        do {
          if (0 < iVar5) {
            lVar24 = 0;
            lVar12 = lVar25;
            do {
              if (0 < (int)uVar4) {
                uVar20 = 0;
                lVar28 = lVar12;
                do {
                  if (0 < (int)uVar3) {
                    puVar26 = (undefined4 *)((long)src0->data + lVar28);
                    uVar27 = 0;
                    do {
                      *(undefined4 *)((long)pvVar11 + uVar27 * 4 + (long)iVar18 * 4) = *puVar26;
                      uVar27 = uVar27 + 1;
                      puVar26 = (undefined4 *)((long)puVar26 + sVar7);
                    } while (uVar15 != uVar27);
                    iVar18 = iVar18 + (int)uVar27;
                  }
                  uVar20 = uVar20 + 1;
                  lVar28 = lVar28 + uVar8;
                } while (uVar20 != uVar14);
              }
              lVar24 = lVar24 + 1;
              lVar12 = lVar12 + sVar9;
            } while (lVar24 != lVar22);
          }
          uVar17 = uVar17 + 1;
          lVar25 = lVar25 + sVar10;
        } while (uVar17 != uVar13);
        return;
      }
      return;
    }
    break;
  default:
    return;
  }
  ggml_compute_forward_dup_cold_5();
LAB_0012de1b:
  ggml_compute_forward_dup_cold_10();
}

Assistant:

static void ggml_compute_forward_dup(
        const struct ggml_compute_params * params,
        const struct ggml_tensor * src0,
        struct ggml_tensor * dst) {
    switch (src0->type) {
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_dup_f16(params, src0, dst);
            } break;
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_dup_f32(params, src0, dst);
            } break;
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_I8:
        case GGML_TYPE_I16:
        case GGML_TYPE_I32:
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }
}